

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

boolean smoothing_ok(j_decompress_ptr cinfo)

{
  jpeg_d_coef_controller *pjVar1;
  short *psVar2;
  _func_void_j_decompress_ptr *p_Var3;
  int (*paiVar4) [64];
  _func_void_j_decompress_ptr *local_50;
  int *coef_bits_latch;
  int *coef_bits;
  JQUANT_TBL *qtable;
  jpeg_component_info *compptr;
  int local_28;
  int coefi;
  int ci;
  boolean smoothing_useful;
  my_coef_ptr coef;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->coef;
  coefi = 0;
  if ((cinfo->progressive_mode == 0) || (cinfo->coef_bits == (int (*) [64])0x0)) {
    cinfo_local._4_4_ = 0;
  }
  else {
    if (pjVar1[5].start_output_pass == (_func_void_j_decompress_ptr *)0x0) {
      p_Var3 = (_func_void_j_decompress_ptr *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x18);
      pjVar1[5].start_output_pass = p_Var3;
    }
    local_50 = pjVar1[5].start_output_pass;
    local_28 = 0;
    qtable = (JQUANT_TBL *)cinfo->comp_info;
    for (; local_28 < cinfo->num_components; local_28 = local_28 + 1) {
      psVar2 = *(short **)(qtable->quantval + 0x28);
      if (psVar2 == (short *)0x0) {
        return 0;
      }
      if ((((*psVar2 == 0) || (psVar2[1] == 0)) || (psVar2[8] == 0)) ||
         (((psVar2[0x10] == 0 || (psVar2[9] == 0)) || (psVar2[2] == 0)))) {
        return 0;
      }
      paiVar4 = cinfo->coef_bits + local_28;
      if ((*paiVar4)[0] < 0) {
        return 0;
      }
      for (compptr._4_4_ = 1; compptr._4_4_ < 6; compptr._4_4_ = compptr._4_4_ + 1) {
        *(int *)(local_50 + (long)compptr._4_4_ * 4) = (*paiVar4)[compptr._4_4_];
        if ((*paiVar4)[compptr._4_4_] != 0) {
          coefi = 1;
        }
      }
      local_50 = local_50 + 0x18;
      qtable = (JQUANT_TBL *)(qtable->quantval + 0x30);
    }
    cinfo_local._4_4_ = coefi;
  }
  return cinfo_local._4_4_;
}

Assistant:

LOCAL(boolean)
smoothing_ok (j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  boolean smoothing_useful = FALSE;
  int ci, coefi;
  jpeg_component_info *compptr;
  JQUANT_TBL * qtable;
  int * coef_bits;
  int * coef_bits_latch;

  if (! cinfo->progressive_mode || cinfo->coef_bits == NULL)
    return FALSE;

  /* Allocate latch area if not already done */
  if (coef->coef_bits_latch == NULL)
    coef->coef_bits_latch = (int *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  cinfo->num_components *
				  (SAVED_COEFS * SIZEOF(int)));
  coef_bits_latch = coef->coef_bits_latch;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* All components' quantization values must already be latched. */
    if ((qtable = compptr->quant_table) == NULL)
      return FALSE;
    /* Verify DC & first 5 AC quantizers are nonzero to avoid zero-divide. */
    if (qtable->quantval[0] == 0 ||
	qtable->quantval[Q01_POS] == 0 ||
	qtable->quantval[Q10_POS] == 0 ||
	qtable->quantval[Q20_POS] == 0 ||
	qtable->quantval[Q11_POS] == 0 ||
	qtable->quantval[Q02_POS] == 0)
      return FALSE;
    /* DC values must be at least partly known for all components. */
    coef_bits = cinfo->coef_bits[ci];
    if (coef_bits[0] < 0)
      return FALSE;
    /* Block smoothing is helpful if some AC coefficients remain inaccurate. */
    for (coefi = 1; coefi <= 5; coefi++) {
      coef_bits_latch[coefi] = coef_bits[coefi];
      if (coef_bits[coefi] != 0)
	smoothing_useful = TRUE;
    }
    coef_bits_latch += SAVED_COEFS;
  }

  return smoothing_useful;
}